

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_parser.c
# Opt level: O3

_Bool parse_PRG_rom(uint8_t *rom_data)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  _Bool _Var3;
  uint8_t **ppuVar4;
  uint8_t *puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char *__s;
  
  uVar2 = parsed_header.PRG_ROM_chunks;
  uVar7 = (ulong)(uint)parsed_header.PRG_ROM_chunks;
  ppuVar4 = (uint8_t **)malloc((ulong)((uint)parsed_header.PRG_ROM_chunks * 8));
  PRG_rom_banks = ppuVar4;
  if (ppuVar4 == (uint8_t **)0x0) {
    __s = "ERROR: Failed to malloc pointers for PRG_ROM banks";
LAB_0010d1dc:
    puts(__s);
    _Var3 = true;
  }
  else {
    if (uVar7 != 0) {
      uVar8 = 0;
      __s = "ERROR: Failed to malloc space for PRG_ROM bank";
      do {
        puVar5 = (uint8_t *)malloc(0x4000);
        ppuVar4[uVar8] = puVar5;
        if (puVar5 == (uint8_t *)0x0) goto LAB_0010d1dc;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
      if (uVar2 != '\0') {
        puVar5 = rom_data + 0x10;
        uVar8 = 0;
        do {
          puVar1 = ppuVar4[uVar8];
          lVar6 = 0;
          do {
            puVar1[lVar6] = puVar5[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x4000);
          uVar8 = uVar8 + 1;
          puVar5 = puVar5 + 0x4000;
        } while (uVar8 != uVar7);
      }
    }
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

bool parse_PRG_rom(uint8_t* rom_data) {
    PRG_rom_banks = malloc(parsed_header.PRG_ROM_chunks * sizeof(uint8_t*));
    if(PRG_rom_banks == NULL) {
        printf("ERROR: Failed to malloc pointers for PRG_ROM banks\n");
        return true;
    }

    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        PRG_rom_banks[bank_num] = malloc(PRG_BANK_SIZE * sizeof(uint8_t));
        if(PRG_rom_banks[bank_num] == NULL) {
            printf("ERROR: Failed to malloc space for PRG_ROM bank\n");
            return true;
        }
    }

    uint32_t bank_starting_rom_address;
    uint32_t bank_ending_rom_address;
    uint8_t* bank_to_fill;
    uint16_t bank_address;
    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        bank_starting_rom_address = GAME_DATA_START + (PRG_BANK_SIZE * bank_num);
        bank_ending_rom_address   = GAME_DATA_START + (PRG_BANK_SIZE * (bank_num + 1));
        bank_to_fill              = PRG_rom_banks[bank_num];
        bank_address              = 0;

        for(uint32_t rom_address = bank_starting_rom_address; rom_address < bank_ending_rom_address; rom_address++) {
            bank_to_fill[bank_address++] = rom_data[rom_address];
        }
    }

    return false;
}